

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O2

void __thiscall ODDLParser::Text::set(Text *this,char *buffer,size_t numChars)

{
  char *__dest;
  
  clear(this);
  if (numChars != 0) {
    this->m_len = numChars;
    this->m_capacity = numChars + 1;
    __dest = (char *)operator_new__(numChars + 1);
    this->m_buffer = __dest;
    strncpy(__dest,buffer,numChars);
    __dest[numChars] = '\0';
  }
  return;
}

Assistant:

void Text::set(const char *buffer, size_t numChars) {
    clear();
    if (numChars > 0) {
        m_len = numChars;
        m_capacity = m_len + 1;
        m_buffer = new char[m_capacity];
        strncpy(m_buffer, buffer, numChars);
        m_buffer[numChars] = '\0';
    }
}